

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world_shuffler.cpp
# Opt level: O0

bool __thiscall
WorldShuffler::generate_region_requirement_hint(WorldShuffler *this,HintSource *hint_source)

{
  bool bVar1;
  reference ppWVar2;
  vector<WorldNode_*,_std::allocator<WorldNode_*>_> *forbidden_nodes;
  WorldNode *start_node;
  WorldNode *end_node;
  string *psVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  int local_1ac;
  vector<Item_*,_std::allocator<Item_*>_> local_1a8;
  undefined1 local_180 [8];
  WorldSolver solver;
  WorldRegion *region;
  iterator __end1;
  iterator __begin1;
  vector<WorldRegion_*,_std::allocator<WorldRegion_*>_> *__range1;
  WorldRegion *hinted_region;
  HintSource *hint_source_local;
  WorldShuffler *this_local;
  
  __range1 = (vector<WorldRegion_*,_std::allocator<WorldRegion_*>_> *)0x0;
  __end1 = std::vector<WorldRegion_*,_std::allocator<WorldRegion_*>_>::begin
                     (&this->_hintable_region_requirements);
  region = (WorldRegion *)
           std::vector<WorldRegion_*,_std::allocator<WorldRegion_*>_>::end
                     (&this->_hintable_region_requirements);
  while (bVar1 = __gnu_cxx::
                 operator==<WorldRegion_**,_std::vector<WorldRegion_*,_std::allocator<WorldRegion_*>_>_>
                           (&__end1,(__normal_iterator<WorldRegion_**,_std::vector<WorldRegion_*,_std::allocator<WorldRegion_*>_>_>
                                     *)&region), ((bVar1 ^ 0xffU) & 1) != 0) {
    ppWVar2 = __gnu_cxx::
              __normal_iterator<WorldRegion_**,_std::vector<WorldRegion_*,_std::allocator<WorldRegion_*>_>_>
              ::operator*(&__end1);
    solver._debug_log.m_value.object = (object_t *)*ppWVar2;
    WorldSolver::WorldSolver((WorldSolver *)local_180,this->_world);
    forbidden_nodes = WorldRegion::nodes((WorldRegion *)solver._debug_log.m_value.object);
    WorldSolver::forbid_taking_items_from_nodes((WorldSolver *)local_180,forbidden_nodes);
    start_node = RandomizerWorld::spawn_node(this->_world);
    end_node = HintSource::node(hint_source);
    World::starting_inventory(&local_1a8,&this->_world->super_World);
    bVar1 = WorldSolver::try_to_solve((WorldSolver *)local_180,start_node,end_node,&local_1a8);
    std::vector<Item_*,_std::allocator<Item_*>_>::~vector(&local_1a8);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      __range1 = (vector<WorldRegion_*,_std::allocator<WorldRegion_*>_> *)
                 solver._debug_log.m_value.object;
      vectools::erase_first<WorldRegion*>
                (&this->_hintable_region_requirements,
                 (WorldRegion **)&solver._debug_log.m_value.object);
      local_1ac = 2;
    }
    else {
      local_1ac = 3;
    }
    WorldSolver::~WorldSolver((WorldSolver *)local_180);
    if (local_1ac == 2) break;
    __gnu_cxx::
    __normal_iterator<WorldRegion_**,_std::vector<WorldRegion_*,_std::allocator<WorldRegion_*>_>_>::
    operator++(&__end1);
  }
  if (__range1 == (vector<WorldRegion_*,_std::allocator<WorldRegion_*>_> *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    bVar1 = is_region_avoidable(this,(WorldRegion *)__range1);
    if (bVar1) {
      psVar3 = WorldRegion::hint_name_abi_cxx11_((WorldRegion *)__range1);
      std::operator+(&local_1f0,"What you are looking for is not ",psVar3);
      std::operator+(&local_1d0,&local_1f0,".");
      HintSource::text(hint_source,&local_1d0);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_1f0);
    }
    else {
      psVar3 = WorldRegion::hint_name_abi_cxx11_((WorldRegion *)__range1);
      std::operator+(&local_230,"You might have a pleasant surprise wandering ",psVar3);
      std::operator+(&local_210,&local_230,".");
      HintSource::text(hint_source,&local_210);
      std::__cxx11::string::~string((string *)&local_210);
      std::__cxx11::string::~string((string *)&local_230);
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool WorldShuffler::generate_region_requirement_hint(HintSource* hint_source)
{
    WorldRegion* hinted_region = nullptr;
    for(WorldRegion* region : _hintable_region_requirements)
    {
        // Check that taking items from region is not mandatory to reach the hint source
        WorldSolver solver(_world);
        solver.forbid_taking_items_from_nodes(region->nodes());
        if(!solver.try_to_solve(_world.spawn_node(), hint_source->node(), _world.starting_inventory()))
            continue;

        hinted_region = region;
        vectools::erase_first(_hintable_region_requirements, region);
        break;
    }

    if(!hinted_region)
        return false;

    if (this->is_region_avoidable(hinted_region))
        hint_source->text("What you are looking for is not " + hinted_region->hint_name() + ".");
    else
        hint_source->text("You might have a pleasant surprise wandering " + hinted_region->hint_name() + ".");

    return true;
}